

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# prim-types.hh
# Opt level: O0

void __thiscall
tinyusdz::TypedAttributeWithFallback<tinyusdz::Animatable<tinyusdz::value::color3f>_>::
set_connection(TypedAttributeWithFallback<tinyusdz::Animatable<tinyusdz::value::color3f>_> *this,
              Path *path)

{
  Path *path_local;
  TypedAttributeWithFallback<tinyusdz::Animatable<tinyusdz::value::color3f>_> *this_local;
  
  ::std::vector<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>::clear(&this->_paths);
  ::std::vector<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>::push_back(&this->_paths,path);
  return;
}

Assistant:

void set_connection(const Path &path) {
    _paths.clear();
    _paths.push_back(path);
  }